

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void __thiscall spatial_region::fout_tracks(spatial_region *this,double a,int nm)

{
  double *pdVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  cellp *pcVar5;
  long lVar6;
  string file_name;
  char file_num_pchar [20];
  ofstream fout;
  
  for (lVar3 = 0; lVar3 < this->nx; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 < this->ny; lVar4 = lVar4 + 1) {
      for (lVar6 = 0; lVar6 < this->nz; lVar6 = lVar6 + 1) {
        pcVar5 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                 ._M_t.super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                 super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar3][lVar4] + lVar6;
        while (pdVar1 = &((pcVar5->pl).head)->x, pdVar1 != (double *)0x0) {
          if (*(int *)(pdVar1 + 10) != 0) {
            if ((double)nm <= *pdVar1) {
              if (*pdVar1 < (double)(this->nx - nm)) {
                file_name._M_dataplus._M_p = (pointer)&file_name.field_2;
                file_name._M_string_length = 0;
                file_name.field_2._M_local_buf[0] = '\0';
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fout,&this->data_folder,"/track_");
                std::__cxx11::string::operator=((string *)&file_name,(string *)&fout);
                std::__cxx11::string::~string((string *)&fout);
                sprintf(file_num_pchar,"%g",pdVar1[8]);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fout,&file_name,file_num_pchar);
                std::__cxx11::string::operator=((string *)&file_name,(string *)&fout);
                std::__cxx11::string::~string((string *)&fout);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fout,&file_name,"_");
                std::__cxx11::string::operator=((string *)&file_name,(string *)&fout);
                std::__cxx11::string::~string((string *)&fout);
                sprintf(file_num_pchar,"%d",(ulong)*(uint *)(pdVar1 + 10));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fout,&file_name,file_num_pchar);
                std::__cxx11::string::operator=((string *)&file_name,(string *)&fout);
                std::__cxx11::string::~string((string *)&fout);
                std::ofstream::ofstream
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fout,file_name._M_dataplus._M_p,_S_app);
                poVar2 = std::ostream::_M_insert<double>(pdVar1[7]);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>
                                   ((*pdVar1 * this->dx * 0.5) / 3.141592653589793 + a);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>
                                   ((pdVar1[1] * this->dy * 0.5) / 3.141592653589793);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>
                                   ((pdVar1[2] * this->dz * 0.5) / 3.141592653589793);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>(pdVar1[3]);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>(pdVar1[4]);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>(pdVar1[5]);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>(pdVar1[6]);
                std::operator<<(poVar2,'\n');
                poVar2 = std::ostream::_M_insert<double>(pdVar1[9]);
                std::operator<<(poVar2,'\n');
                std::ofstream::~ofstream
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fout);
                std::__cxx11::string::~string((string *)&file_name);
              }
            }
          }
          pcVar5 = (cellp *)(pdVar1 + 0xb);
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::fout_tracks(double a, int nm) {
    for (int i=0;i<nx;i++) {
        for (int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                particle* current;
                current = cp[i][j][k].pl.head;
                while (current!=0) {
                    if (current->trn!=0 && current->x>=nm && current->x<nx-nm) {
                        std::string file_name;
                        char file_num_pchar[20];
                        file_name = spatial_region::data_folder+"/track_";
                        sprintf(file_num_pchar,"%g",current->cmr);
                        file_name = file_name + file_num_pchar;
                        file_name = file_name + "_";
                        sprintf(file_num_pchar,"%d",current->trn);
                        file_name = file_name + file_num_pchar;
                        ofstream fout(file_name.c_str(),ios::app);
                        #ifdef QUILL_NOQED
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<< 0.0 <<'\n';
                        #else
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<<current->chi<<'\n';
                        #endif
                    }
                    current = current->next;
                }
            }
        }
    }
}